

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::Logging::formatLine
                (StringBuilder *sb,uint8_t *binData,size_t binLen,size_t dispLen,size_t imLen,
                char *comment)

{
  Error EVar1;
  StringBuilder *this;
  ulong in_RCX;
  ulong in_RDX;
  long in_RDI;
  long in_R9;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  size_t begin;
  size_t i_1;
  char sep;
  size_t align;
  size_t commentLen;
  size_t currentLen;
  size_t i;
  char *in_stack_00000290;
  int in_stack_0000029c;
  char *in_stack_000002a0;
  size_t n;
  char in_stack_fffffffffffffea3;
  uint32_t in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  Error in_stack_fffffffffffffeac;
  Error in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Error in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  long lVar2;
  uint32_t op;
  char local_129;
  ulong local_128;
  ulong local_118;
  ulong local_d8;
  
  local_118 = *(ulong *)(in_RDI + 8);
  if (in_R9 == 0) {
    local_d8 = 0;
  }
  else {
    for (local_d8 = 0; (local_d8 < 0x200 && (*(char *)(in_R9 + local_d8) != '\0'));
        local_d8 = local_d8 + 1) {
    }
  }
  if (in_RDX < in_RCX) {
    DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
  }
  if (((in_RDX != 0) && (in_RDX != 0xffffffffffffffff)) || (local_d8 != 0)) {
    local_128 = 0x28;
    local_129 = ';';
    n = local_d8;
    for (this = (StringBuilder *)(ulong)(in_RDX == 0xffffffffffffffff); this < (StringBuilder *)0x2;
        this = (StringBuilder *)((long)&this->_data + 1)) {
      lVar2 = *(long *)(in_RDI + 8);
      if (local_118 < local_128) {
        EVar1 = StringBuilder::_opChars
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           in_stack_fffffffffffffea4,in_stack_fffffffffffffea3,n);
        if (EVar1 != 0) {
          return EVar1;
        }
        in_stack_fffffffffffffebc = 0;
      }
      if (local_129 != '\0') {
        in_stack_fffffffffffffeb8 =
             StringBuilder::_opChar
                       ((StringBuilder *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        in_stack_fffffffffffffea4,in_stack_fffffffffffffea3);
        if (in_stack_fffffffffffffeb8 != 0) {
          return in_stack_fffffffffffffeb8;
        }
        EVar1 = StringBuilder::_opChar
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           in_stack_fffffffffffffea4,in_stack_fffffffffffffea3);
        if (EVar1 != 0) {
          return EVar1;
        }
        in_stack_fffffffffffffeb4 = 0;
      }
      op = (uint32_t)((ulong)lVar2 >> 0x20);
      if (this == (StringBuilder *)0x0) {
        in_stack_fffffffffffffeb0 =
             StringBuilder::_opHex
                       ((StringBuilder *)0x0,op,
                        (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        if (in_stack_fffffffffffffeb0 != 0) {
          return in_stack_fffffffffffffeb0;
        }
        in_stack_fffffffffffffeac =
             StringBuilder::_opChars
                       ((StringBuilder *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        in_stack_fffffffffffffea4,in_stack_fffffffffffffea3,n);
        if (in_stack_fffffffffffffeac != 0) {
          return in_stack_fffffffffffffeac;
        }
        EVar1 = StringBuilder::_opHex
                          (this,(uint32_t)((ulong)lVar2 >> 0x20),
                           (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        if (EVar1 != 0) {
          return EVar1;
        }
        in_stack_fffffffffffffea8 = 0;
        if (local_d8 == 0) break;
      }
      else {
        EVar1 = StringBuilder::_opString
                          (this,op,(char *)CONCAT44(in_stack_fffffffffffffebc,
                                                    in_stack_fffffffffffffeb8),
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        if (EVar1 != 0) {
          return EVar1;
        }
        in_stack_fffffffffffffea4 = 0;
      }
      local_118 = (*(long *)(in_RDI + 8) - lVar2) + local_118;
      local_128 = local_128 + 0x1a;
      local_129 = '|';
    }
  }
  EVar1 = StringBuilder::_opChar
                    ((StringBuilder *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea4,in_stack_fffffffffffffea3);
  return EVar1;
}

Assistant:

Error Logging::formatLine(StringBuilder& sb, const uint8_t* binData, size_t binLen, size_t dispLen, size_t imLen, const char* comment) noexcept {
  size_t currentLen = sb.getLength();
  size_t commentLen = comment ? Utils::strLen(comment, kMaxCommentLength) : 0;

  ASMJIT_ASSERT(binLen >= dispLen);

  if ((binLen != 0 && binLen != Globals::kInvalidIndex) || commentLen) {
    size_t align = kMaxInstLength;
    char sep = ';';

    for (size_t i = (binLen == Globals::kInvalidIndex); i < 2; i++) {
      size_t begin = sb.getLength();

      // Append align.
      if (currentLen < align)
        ASMJIT_PROPAGATE(sb.appendChars(' ', align - currentLen));

      // Append separator.
      if (sep) {
        ASMJIT_PROPAGATE(sb.appendChar(sep));
        ASMJIT_PROPAGATE(sb.appendChar(' '));
      }

      // Append binary data or comment.
      if (i == 0) {
        ASMJIT_PROPAGATE(sb.appendHex(binData, binLen - dispLen - imLen));
        ASMJIT_PROPAGATE(sb.appendChars('.', dispLen * 2));
        ASMJIT_PROPAGATE(sb.appendHex(binData + binLen - imLen, imLen));
        if (commentLen == 0) break;
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString(comment, commentLen));
      }

      currentLen += sb.getLength() - begin;
      align += kMaxBinaryLength;
      sep = '|';
    }
  }

  return sb.appendChar('\n');
}